

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool ConnectToSocket(Sock *sock,sockaddr *sockaddr,socklen_t len,string *dest_str,
                    bool manual_connection)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  Logger *this;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  socklen_t sockerr_len;
  int sockerr;
  Event occurred;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*sock->_vptr_Sock[5])(sock,sockaddr,CONCAT44(in_register_00000014,len));
  bVar1 = true;
  if (iVar2 != -1) goto LAB_00d9c43a;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  if (((iVar2 == 0xb) || (iVar2 == 0x73)) || (iVar2 == 0x16)) {
    iVar2 = (*sock->_vptr_Sock[0xe])(sock,(long)nConnectTimeout,3,&occurred);
    if ((char)iVar2 == '\0') {
      NetworkErrorString_abi_cxx11_(&local_50,*piVar3);
      logging_function._M_str = "ConnectToSocket";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file._M_len = 0x54;
      LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x249,ALL,Info,"wait for connect to %s failed: %s\n",
                 dest_str,&local_50);
      goto LAB_00d9c41c;
    }
    if (occurred != '\0') {
      iVar2 = (*sock->_vptr_Sock[9])(sock,1,4,&sockerr);
      if (iVar2 == -1) {
        NetworkErrorString_abi_cxx11_(&local_50,*piVar3);
        logging_function_01._M_str = "ConnectToSocket";
        logging_function_01._M_len = 0xf;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_01._M_len = 0x54;
        LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_01,source_file_01,600,ALL,Info,
                   "getsockopt() for %s failed: %s\n",dest_str,&local_50);
      }
      else {
        if (sockerr == 0) goto LAB_00d9c43a;
        NetworkErrorString_abi_cxx11_(&local_50,sockerr);
        LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
                  (manual_connection,"connect() to %s failed after wait: %s",dest_str,&local_50);
      }
      goto LAB_00d9c41c;
    }
    this = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this,NET,Debug);
    if (bVar1) {
      logging_function_00._M_str = "ConnectToSocket";
      logging_function_00._M_len = 0xf;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file_00._M_len = 0x54;
      LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_00,0x24c,NET,Debug,
                 "connection attempt to %s timed out\n",dest_str);
    }
  }
  else {
    NetworkErrorString_abi_cxx11_(&local_50,*piVar3);
    LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
              (manual_connection,"connect() to %s failed: %s",dest_str,&local_50);
LAB_00d9c41c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = false;
LAB_00d9c43a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool ConnectToSocket(const Sock& sock, struct sockaddr* sockaddr, socklen_t len, const std::string& dest_str, bool manual_connection)
{
    // Connect to `sockaddr` using `sock`.
    if (sock.Connect(sockaddr, len) == SOCKET_ERROR) {
        int nErr = WSAGetLastError();
        // WSAEINVAL is here because some legacy version of winsock uses it
        if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL)
        {
            // Connection didn't actually fail, but is being established
            // asynchronously. Thus, use async I/O api (select/poll)
            // synchronously to check for successful connection with a timeout.
            const Sock::Event requested = Sock::RECV | Sock::SEND;
            Sock::Event occurred;
            if (!sock.Wait(std::chrono::milliseconds{nConnectTimeout}, requested, &occurred)) {
                LogPrintf("wait for connect to %s failed: %s\n",
                          dest_str,
                          NetworkErrorString(WSAGetLastError()));
                return false;
            } else if (occurred == 0) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "connection attempt to %s timed out\n", dest_str);
                return false;
            }

            // Even if the wait was successful, the connect might not
            // have been successful. The reason for this failure is hidden away
            // in the SO_ERROR for the socket in modern systems. We read it into
            // sockerr here.
            int sockerr;
            socklen_t sockerr_len = sizeof(sockerr);
            if (sock.GetSockOpt(SOL_SOCKET, SO_ERROR, (sockopt_arg_type)&sockerr, &sockerr_len) ==
                SOCKET_ERROR) {
                LogPrintf("getsockopt() for %s failed: %s\n", dest_str, NetworkErrorString(WSAGetLastError()));
                return false;
            }
            if (sockerr != 0) {
                LogConnectFailure(manual_connection,
                                  "connect() to %s failed after wait: %s",
                                  dest_str,
                                  NetworkErrorString(sockerr));
                return false;
            }
        }
#ifdef WIN32
        else if (WSAGetLastError() != WSAEISCONN)
#else
        else
#endif
        {
            LogConnectFailure(manual_connection, "connect() to %s failed: %s", dest_str, NetworkErrorString(WSAGetLastError()));
            return false;
        }
    }
    return true;
}